

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtio.c
# Opt level: O2

uint32_t virtio_tx_batch(ixy_device *ixy,uint16_t queue_id,pkt_buf **bufs,uint32_t num_bufs)

{
  uint uVar1;
  uint *puVar2;
  long lVar3;
  pkt_buf *ppVar4;
  long lVar5;
  uint32_t uVar6;
  ulong uVar7;
  ushort uVar8;
  
  puVar2 = *(uint **)&ixy[1].num_rx_queues;
  while( true ) {
    if ((ushort)puVar2[10] == *(ushort *)(*(long *)(puVar2 + 6) + 2)) break;
    uVar7 = (ulong)*(uint *)(*(long *)(puVar2 + 6) + 4 +
                            ((ulong)(ushort)puVar2[10] % (ulong)*puVar2) * 8);
    lVar3 = *(long *)(puVar2 + 2);
    lVar5 = uVar7 * 0x10;
    *(undefined8 *)(lVar3 + lVar5) = 0;
    *(undefined4 *)(lVar3 + 8 + lVar5) = 0;
    pkt_buf_free(*(pkt_buf **)(puVar2 + uVar7 * 2 + 0xe));
    *(short *)(puVar2 + 10) = (short)puVar2[10] + 1;
  }
  uVar8 = 0;
  for (uVar7 = 0; uVar6 = num_bufs, uVar7 != num_bufs; uVar7 = uVar7 + 1) {
    ppVar4 = bufs[uVar7];
    while( true ) {
      if ((*puVar2 <= (uint)uVar8) || (*(long *)(*(long *)(puVar2 + 2) + (ulong)uVar8 * 0x10) == 0))
      break;
      uVar8 = uVar8 + 1;
    }
    uVar6 = (uint32_t)uVar7;
    if (*puVar2 == (uint)uVar8) break;
    uVar1 = ppVar4->size;
    ixy[1].get_link_speed = ixy[1].get_link_speed + uVar1;
    ixy[1].read_stats = ixy[1].read_stats + 1;
    *(pkt_buf **)(puVar2 + (ulong)uVar8 * 2 + 0xe) = ppVar4;
    ppVar4->head_room[0x26] = '\0';
    ppVar4->head_room[0x27] = '\0';
    ppVar4->head_room[0x1e] = '\0';
    ppVar4->head_room[0x1f] = '\0';
    ppVar4->head_room[0x20] = '*';
    ppVar4->head_room[0x21] = '\0';
    ppVar4->head_room[0x22] = '\0';
    ppVar4->head_room[0x23] = '\0';
    ppVar4->head_room[0x24] = '\0';
    ppVar4->head_room[0x25] = '\0';
    lVar5 = (ulong)uVar8 * 0x10;
    lVar3 = *(long *)(puVar2 + 2);
    *(uint *)(lVar3 + 8 + lVar5) = uVar1 + 10;
    *(uintptr_t *)(lVar3 + lVar5) = ppVar4->buf_addr_phy + 0x36;
    *(undefined4 *)(lVar3 + 0xc + lVar5) = 0;
    *(ushort *)
     (*(long *)(puVar2 + 4) + 4 +
     ((ulong)(*(ushort *)(*(long *)(puVar2 + 4) + 2) + uVar6) % (ulong)*puVar2) * 2) = uVar8;
  }
  *(short *)(*(long *)(puVar2 + 4) + 2) = *(short *)(*(long *)(puVar2 + 4) + 2) + (short)uVar6;
  virtio_legacy_notify_queue((virtio_device *)ixy,1);
  return uVar6;
}

Assistant:

uint32_t virtio_tx_batch(struct ixy_device* ixy, uint16_t queue_id, struct pkt_buf* bufs[], uint32_t num_bufs) {
	struct virtio_device* dev = IXY_TO_VIRTIO(ixy);
	struct virtqueue* vq = dev->tx_queue;

	_mm_mfence();
	// Free sent buffers
	while (vq->vq_used_last_idx != vq->vring.used->idx) {
		// info("We can free some buffers: %u != %u", vq->vq_used_last_idx,
		// vq->vring.used->idx);
		struct vring_used_elem* e = vq->vring.used->ring + (vq->vq_used_last_idx % vq->vring.num);
		// info("e %p, id %u", e, e->id);
		struct vring_desc* desc = &vq->vring.desc[e->id];
		desc->addr = 0;
		desc->len = 0;
		pkt_buf_free(vq->virtual_addresses[e->id]);
		vq->vq_used_last_idx++;
		_mm_mfence();
	}
	// Send buffers
	uint32_t buf_idx;
	uint16_t idx = 0; // Keep index of last found free descriptor and start searching from there
	for (buf_idx = 0; buf_idx < num_bufs; ++buf_idx) {
		struct pkt_buf* buf = bufs[buf_idx];
		// Find free desc index
		for (; idx < vq->vring.num; ++idx) {
			struct vring_desc* desc = &vq->vring.desc[idx];
			if (desc->addr == 0) {
				break;
			}
		}
		if (idx == vq->vring.num) {
			break;
		}
		// info("Found free desc slot at %u (%u)", idx, vq->vring.num);

		// Update tx counter
		dev->tx_bytes += buf->size;
		dev->tx_pkts++;

		vq->virtual_addresses[idx] = buf;

		// Copy header to headroom in front of data buffer
		memcpy(buf->head_room + sizeof(buf->head_room) - sizeof(net_hdr), &net_hdr, sizeof(net_hdr));

		vq->vring.desc[idx].len = buf->size + sizeof(net_hdr);
		vq->vring.desc[idx].addr =
			buf->buf_addr_phy + offsetof(struct pkt_buf, head_room) + sizeof(buf->head_room) - sizeof(net_hdr);
		vq->vring.desc[idx].flags = 0;
		vq->vring.desc[idx].next = 0;
		vq->vring.avail->ring[(vq->vring.avail->idx + buf_idx) % vq->vring.num] = idx;
	}
	_mm_mfence();
	vq->vring.avail->idx += buf_idx;
	_mm_mfence();
	virtio_legacy_notify_queue(dev, 1);
	return buf_idx;
}